

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcpnatpmpc.c
# Opt level: O0

void parse_opt_dev_id(pcp_params *p)

{
  int iVar1;
  size_t sVar2;
  int machine_len;
  int dev_len;
  int sysname_len;
  utsname sysinfo;
  pcp_params *p_local;
  
  sysinfo.__domainname._57_8_ = p;
  uname((utsname *)((long)&dev_len + 2));
  sVar2 = strlen((char *)((long)&dev_len + 2));
  iVar1 = (int)sVar2;
  if (0 < 0x1f - iVar1) {
    strcpy((char *)(sysinfo.__domainname._57_8_ + 0x16c),(char *)((long)&dev_len + 2));
    strcpy((char *)(sysinfo.__domainname._57_8_ + 0x16c + (long)iVar1)," ");
    sVar2 = strlen(sysinfo.version + 0x39);
    if (0 < (0x1f - iVar1) - (int)sVar2) {
      strcpy((char *)(sysinfo.__domainname._57_8_ + (long)iVar1 + 0x16d),sysinfo.version + 0x39);
    }
  }
  fprintf(_stderr,"Device-id: %s \n",sysinfo.__domainname._57_8_ + 0x16c);
  return;
}

Assistant:

static inline void parse_opt_dev_id(struct pcp_params *p) {
#ifndef WIN32
    struct utsname sysinfo;
    int sysname_len, dev_len, machine_len;

    /* uname is not support on 4.3BSD and earlier */
    uname(&sysinfo);
    sysname_len = strlen((const char *)&sysinfo.sysname);
    dev_len = MAX_DEVICE_ID - sysname_len - 1;
    if (dev_len > 0) {
        strcpy(&(p->app_deviceid.deviceid[0]), (const char *)&sysinfo.sysname);
        strcpy(p->app_deviceid.deviceid + sysname_len, " ");

        machine_len = strlen((const char *)&sysinfo.machine);
        if (dev_len - machine_len > 0) {
            strcpy(p->app_deviceid.deviceid + sysname_len + 1,
                   (const char *)&sysinfo.machine);
        }
    }
    fprintf(stderr, "Device-id: %s \n", &(p->app_deviceid.deviceid[0]));

    /* BSD 4.3 version
    int len = 0, size = 0;
    sysctlbyname("hw.machine", NULL, &size, NULL, 0);

    if (len) {
     char *machine = malloc(len*sizeof(char));
     sysctlbyname("hw.machine", machine, &size, NULL, 0);
     fprintf (stderr, "Machine: %s \n", machine);
     free(machine);
     exit(0);
    }
    *
    */
#endif // WIN32
}